

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack11_32(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  auVar7 = *(undefined1 (*) [16])(in + 1);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x10100000008));
  uVar2 = *in;
  auVar1 = *(undefined1 (*) [16])(in + 5);
  auVar10 = vpmovsxbd_avx512f(_DAT_00197570);
  auVar8 = vpmovsxbd_avx2(ZEXT816(0x302020201010100));
  *out = uVar2 & 0x7ff;
  uVar3 = in[6];
  auVar9 = vpermi2q_avx512f(auVar9,ZEXT1664(auVar7),ZEXT464(uVar2));
  auVar7 = vpshufd_avx(auVar7,0xb1);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_00197520);
  auVar11 = vpbroadcastd_avx512f(ZEXT416(0x7ff));
  auVar8 = vpermd_avx2(auVar8,ZEXT1632(auVar1));
  auVar7 = vpand_avx(auVar7,_DAT_00197530);
  auVar9 = vpermi2d_avx512f(auVar10,auVar9,ZEXT1664(auVar1));
  auVar9 = vpsrlvd_avx512f(auVar9,_DAT_001a93c0);
  auVar10 = vshufi64x2_avx512f(ZEXT1664(auVar7),ZEXT1664(auVar7),0);
  auVar12 = vpbroadcastd_avx512f();
  auVar13._0_52_ = auVar10._0_52_;
  auVar13._52_4_ = auVar12._52_4_;
  auVar13._56_4_ = auVar10._56_4_;
  auVar13._60_4_ = auVar10._60_4_;
  auVar10 = vpandd_avx512f(auVar9,auVar11);
  auVar9 = vpord_avx512f(auVar9,auVar13);
  auVar12._4_4_ = auVar9._4_4_;
  auVar12._0_4_ = auVar10._0_4_;
  auVar12._8_4_ = auVar10._8_4_;
  auVar12._12_4_ = auVar10._12_4_;
  auVar12._16_4_ = auVar9._16_4_;
  auVar12._20_4_ = auVar10._20_4_;
  auVar12._24_4_ = auVar10._24_4_;
  auVar12._28_4_ = auVar9._28_4_;
  auVar12._32_4_ = auVar10._32_4_;
  auVar12._36_4_ = auVar10._36_4_;
  auVar12._40_4_ = auVar9._40_4_;
  auVar12._44_4_ = auVar10._44_4_;
  auVar12._48_4_ = auVar10._48_4_;
  auVar12._52_4_ = auVar9._52_4_;
  auVar12._56_4_ = auVar10._56_4_;
  auVar12._60_4_ = auVar10._60_4_;
  auVar7._8_8_ = *(undefined8 *)(in + 7);
  auVar7._0_8_ = *(undefined8 *)(in + 7);
  auVar6 = vpsrlvd_avx2(auVar8,_DAT_00194300);
  uVar2 = in[9];
  auVar7 = vpsllvd_avx2(auVar7,_DAT_00197540);
  auVar9 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])(out + 1) = auVar9;
  auVar8 = vpmovsxbq_avx2(ZEXT416(0x1000008));
  auVar5._8_8_ = 0x7f8000007f0;
  auVar5._0_8_ = 0x7f8000007f0;
  auVar7 = vpandq_avx512vl(auVar7,auVar5);
  auVar8 = vpermi2d_avx512vl(auVar8,ZEXT1632(auVar7),ZEXT432((uVar3 & 0x3f) << 5));
  auVar4 = vpor_avx2(auVar6,auVar8);
  auVar8 = vpand_avx2(auVar6,auVar11._0_32_);
  auVar8 = vpblendd_avx2(auVar8,auVar4,0x49);
  *(undefined1 (*) [32])(out + 0x11) = auVar8;
  auVar7 = vpshufd_avx(auVar1,0xff);
  auVar1 = vpinsrd_avx(auVar11._0_16_,uVar2 * 4 & 0x7fc,1);
  uVar3 = in[10];
  auVar7 = vpinsrd_avx(auVar7,uVar2,1);
  auVar7 = vpshufd_avx(auVar7,0x50);
  auVar5 = vpsrlvd_avx2(auVar7,_DAT_00197560);
  auVar7 = vpand_avx(auVar5,auVar11._0_16_);
  auVar1 = vpor_avx(auVar5,auVar1);
  auVar7 = vpblendd_avx2(auVar7,auVar1,2);
  *(undefined1 (*) [16])(out + 0x19) = auVar7;
  out[0x1d] = uVar2 >> 0x1f | (uVar3 & 0x3ff) << 1;
  out[0x1e] = uVar3 >> 10 & 0x7ff;
  out[0x1f] = uVar3 >> 0x15;
  return in + 0xb;
}

Assistant:

const uint32_t *__fastunpack11_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 11);
  out++;
  *out = ((*in) >> 11) % (1U << 11);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 1)) << (11 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 11);
  out++;
  *out = ((*in) >> 12) % (1U << 11);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 2)) << (11 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 11);
  out++;
  *out = ((*in) >> 13) % (1U << 11);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 3)) << (11 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 11);
  out++;
  *out = ((*in) >> 14) % (1U << 11);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 4)) << (11 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 11);
  out++;
  *out = ((*in) >> 15) % (1U << 11);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 5)) << (11 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 11);
  out++;
  *out = ((*in) >> 16) % (1U << 11);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 6)) << (11 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 11);
  out++;
  *out = ((*in) >> 17) % (1U << 11);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 7)) << (11 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 11);
  out++;
  *out = ((*in) >> 18) % (1U << 11);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 8)) << (11 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 11);
  out++;
  *out = ((*in) >> 19) % (1U << 11);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 9)) << (11 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 11);
  out++;
  *out = ((*in) >> 20) % (1U << 11);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 10)) << (11 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 11);
  out++;
  *out = ((*in) >> 21);
  ++in;
  out++;

  return in;
}